

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O2

_Bool HMAC_Validate(COSE_MacMessage *pcose,int HSize,int TSize,byte *pbKey,size_t cbKey,
                   byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  cose_error cVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  uchar *output;
  cn_cbor *pcVar4;
  ulong uVar5;
  char *md_name;
  mbedtls_md_context_t contx;
  
  if (HSize == 0x100) {
    md_name = "SHA256";
LAB_001c2ac5:
    mbedtls_md_init(&contx);
    md_info = mbedtls_md_info_from_string(md_name);
    mbedtls_md_setup(&contx,md_info,1);
    bVar2 = mbedtls_md_get_size(md_info);
    output = (uchar *)calloc((ulong)bVar2,1);
    if (output == (uchar *)0x0) {
      output = (uchar *)0x0;
      if (perr == (cose_errback *)0x0) goto LAB_001c2b66;
      cVar1 = COSE_ERR_OUT_OF_MEMORY;
    }
    else {
      iVar3 = mbedtls_md_hmac_starts(&contx,pbKey,cbKey);
      if (((iVar3 == 0) &&
          (iVar3 = mbedtls_md_hmac_update(&contx,pbAuthData,cbAuthData), iVar3 == 0)) &&
         (iVar3 = mbedtls_md_hmac_finish(&contx,output), iVar3 == 0)) {
        pcVar4 = _COSE_arrayget_int(&pcose->m_message,3);
        if (pcVar4 != (cn_cbor *)0x0) {
          if ((int)(uint)bVar2 < pcVar4->length) {
            return false;
          }
          bVar2 = 0;
          for (uVar5 = 0; (uint)TSize >> 3 != uVar5; uVar5 = uVar5 + 1) {
            bVar2 = bVar2 | (pcVar4->v).bytes[uVar5] != output[uVar5];
          }
          mbedtls_md_free(&contx);
          return (_Bool)(bVar2 ^ 1);
        }
        if (perr == (cose_errback *)0x0) goto LAB_001c2b66;
        cVar1 = COSE_ERR_CBOR;
      }
      else {
        if (perr == (cose_errback *)0x0) goto LAB_001c2b66;
        cVar1 = COSE_ERR_CRYPTO_FAIL;
      }
    }
  }
  else {
    if (HSize == 0x200) {
      md_name = "SHA512";
      goto LAB_001c2ac5;
    }
    if (HSize == 0x180) {
      md_name = "SHA384";
      goto LAB_001c2ac5;
    }
    output = (uchar *)0x0;
    if (perr == (cose_errback *)0x0) goto LAB_001c2b66;
    cVar1 = COSE_ERR_INVALID_PARAMETER;
  }
  perr->err = cVar1;
LAB_001c2b66:
  free(output);
  mbedtls_md_free(&contx);
  return false;
}

Assistant:

bool HMAC_Validate(COSE_MacMessage * pcose, int HSize, int TSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_md_context_t contx;
	const char* md_name;
	const struct mbedtls_md_info_t * info;
	byte * rgbOut = NULL;
	unsigned int cbOut;
	bool f = false;
	unsigned int i;

#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	switch (HSize) {
		case 256: md_name = "SHA256"; break;
		case 384: md_name = "SHA384"; break;
		case 512: md_name = "SHA512"; break;
		default: FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER); break;
	}

	mbedtls_md_init(&contx);
	info = mbedtls_md_info_from_string (md_name);
	mbedtls_md_setup( &contx, info, 1 );
	
	cbOut = mbedtls_md_get_size(info);
	rgbOut = COSE_CALLOC(cbOut, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!(mbedtls_md_hmac_starts (&contx, pbKey, cbKey)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_update (&contx, pbAuthData, cbAuthData)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_finish (&contx, rgbOut)), COSE_ERR_CRYPTO_FAIL);

	cn_cbor * cn = _COSE_arrayget_int(&pcose->m_message, INDEX_MAC_TAG);
	CHECK_CONDITION(cn != NULL, COSE_ERR_CBOR);

	if (cn->length > (int) cbOut) return false;
	for (i = 0; i < (unsigned int) TSize/8; i++) f |= (cn->v.bytes[i] != rgbOut[i]);

	mbedtls_md_free(&contx); 
	return !f;

errorReturn:
	COSE_FREE(rgbOut, context);
	mbedtls_md_free(&contx); 
	return false;
}